

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statemachine.cpp
# Opt level: O0

callback_t *
state_include(callback_t *__return_storage_ptr__,MetaConfiguration *conf,ifstream *f,int *error)

{
  initializer_list<char> __l;
  initializer_list<char> __l_00;
  int *f_00;
  QDebug *pQVar1;
  QLoggingCategory *pQVar2;
  char *category;
  QMessageLogger local_158;
  QDebug local_138 [15];
  bool local_129;
  undefined1 local_128 [7];
  bool qt_category_enabled;
  MetaInclude include;
  vector<char,_std::allocator<char>_> local_e8;
  undefined1 local_d0 [8];
  string include_name;
  QDebug local_90 [11];
  char local_85;
  char start_delimiter;
  allocator_type local_73;
  char local_72 [2];
  iterator local_70;
  size_type local_68;
  vector<char,_std::allocator<char>_> local_60;
  string local_48;
  int *local_28;
  int *error_local;
  ifstream *f_local;
  MetaConfiguration *conf_local;
  
  local_72[0] = '<';
  local_72[1] = 0x22;
  local_70 = local_72;
  local_68 = 2;
  local_28 = error;
  error_local = (int *)f;
  f_local = (ifstream *)conf;
  conf_local = (MetaConfiguration *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  __l_00._M_len = local_68;
  __l_00._M_array = local_70;
  std::vector<char,_std::allocator<char>_>::vector(&local_60,__l_00,&local_73);
  read_untill_delimiters_abi_cxx11_(&local_48,f,&local_60);
  std::__cxx11::string::~string((string *)&local_48);
  std::vector<char,_std::allocator<char>_>::~vector(&local_60);
  std::allocator<char>::~allocator(&local_73);
  local_85 = std::istream::get();
  QMessageLogger::QMessageLogger
            ((QMessageLogger *)((long)&include_name.field_2 + 8),(char *)0x0,0,(char *)0x0);
  QMessageLogger::debug();
  pQVar1 = QDebug::operator<<(local_90,"Delimiter");
  QDebug::operator<<(pQVar1,local_85);
  QDebug::~QDebug(local_90);
  f_00 = error_local;
  include._38_1_ = 0x3e;
  include._39_1_ = 0x22;
  std::allocator<char>::allocator();
  __l._M_len = 2;
  __l._M_array = &include.field_0x26;
  std::vector<char,_std::allocator<char>_>::vector
            (&local_e8,__l,(allocator_type *)&include.field_0x25);
  read_untill_delimiters_abi_cxx11_((string *)local_d0,(ifstream *)f_00,&local_e8);
  std::vector<char,_std::allocator<char>_>::~vector(&local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&include.field_0x25);
  std::istream::ignore();
  std::__cxx11::string::string((string *)local_128,(string *)local_d0);
  include.name.field_2._M_local_buf[8] = local_85 == '<';
  std::vector<MetaInclude,_std::allocator<MetaInclude>_>::push_back
            ((vector<MetaInclude,_std::allocator<MetaInclude>_> *)f_local,(value_type *)local_128);
  pQVar2 = parser();
  local_129 = QLoggingCategory::isDebugEnabled(pQVar2);
  while (local_129 != false) {
    pQVar2 = parser();
    category = QLoggingCategory::categoryName(pQVar2);
    QMessageLogger::QMessageLogger(&local_158,(char *)0x0,0,(char *)0x0,category);
    QMessageLogger::debug();
    pQVar1 = QDebug::operator<<(local_138,"include added: ");
    operator<<(pQVar1,(string *)local_d0);
    QDebug::~QDebug(local_138);
    local_129 = false;
  }
  std::
  function<RecursiveHelper<MetaConfiguration&,std::ifstream&,int&>(MetaConfiguration&,std::ifstream&,int&)>
  ::
  function<std::function<RecursiveHelper<MetaConfiguration&,std::ifstream&,int&>(MetaConfiguration&,std::ifstream&,int&)>(&)(MetaConfiguration&,std::ifstream&,int&),void>
            ((function<RecursiveHelper<MetaConfiguration&,std::ifstream&,int&>(MetaConfiguration&,std::ifstream&,int&)>
              *)__return_storage_ptr__,initial_state);
  MetaInclude::~MetaInclude((MetaInclude *)local_128);
  std::__cxx11::string::~string((string *)local_d0);
  return __return_storage_ptr__;
}

Assistant:

callback_t state_include(MetaConfiguration &conf, std::ifstream &f, int &error) {
  read_untill_delimiters(f, {'<', '"'});

  char start_delimiter = f.get();
  qDebug() << "Delimiter" << start_delimiter;
  std::string include_name = read_untill_delimiters(f, {'>', '"'});
  f.ignore(); // ignore the end delimiter.

  MetaInclude include {
    include_name,
    start_delimiter == '<'
  };

  conf.includes.push_back(include);
  qCDebug(parser) << "include added: " << include_name;
  return initial_state;
}